

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dtoa.hpp
# Opt level: O3

string * __thiscall
czh::utils::fill_double_abi_cxx11_(string *__return_storage_ptr__,utils *this,double v)

{
  int K;
  string buffer;
  int local_54;
  string local_50;
  string local_30;
  
  local_50._M_string_length = 0;
  local_50.field_2._M_local_buf[0] = '\0';
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  grisu2(v,&local_50,&local_54);
  prettify_string(&local_30,&local_50,local_54);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p == &local_30.field_2) {
    (__return_storage_ptr__->field_2)._M_allocated_capacity = local_30.field_2._M_allocated_capacity
    ;
    *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = local_30.field_2._8_8_;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = local_30._M_dataplus._M_p;
    (__return_storage_ptr__->field_2)._M_allocated_capacity = local_30.field_2._M_allocated_capacity
    ;
  }
  __return_storage_ptr__->_M_string_length = local_30._M_string_length;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,
                    CONCAT71(local_50.field_2._M_allocated_capacity._1_7_,
                             local_50.field_2._M_local_buf[0]) + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string fill_double(double v)
  {
    int K;
    std::string buffer;
    grisu2(v, buffer, K);
    return std::move(prettify_string(buffer, K));
  }